

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

int cmsys::SystemTools::EstimateFormatLength(char *format,__va_list_tag *ap)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  
  if (format == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    sVar4 = strlen(format);
    while( true ) {
      iVar3 = (int)sVar4;
      cVar2 = *format;
      if (cVar2 == '\0') break;
      format = format + 1;
      if (cVar2 == '%') {
        uVar7 = (uint)*format;
        sVar6 = sVar4;
        uVar8 = uVar7;
        if (uVar7 != 0x25) {
          while (iVar3 = isalpha(uVar7), iVar3 == 0) {
            pbVar1 = (byte *)(format + 1);
            format = format + 1;
            uVar7 = (uint)(char)*pbVar1;
            uVar8 = (uint)*pbVar1;
          }
          if ((uVar8 & 0xff) - 0x65 < 3) {
            if (ap->fp_offset < 0xa1) {
              ap->fp_offset = ap->fp_offset + 0x10;
              sVar6 = sVar4 + 0x40;
            }
            else {
LAB_00147140:
              ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
              sVar6 = sVar4 + 0x40;
            }
          }
          else if ((uVar8 & 0xff) == 0x73) {
            uVar8 = ap->gp_offset;
            if ((ulong)uVar8 < 0x29) {
              puVar5 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
              ap->gp_offset = uVar8 + 8;
            }
            else {
              puVar5 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar5 + 1;
            }
            if ((char *)*puVar5 != (char *)0x0) {
              sVar6 = strlen((char *)*puVar5);
              sVar6 = sVar4 + sVar6;
            }
          }
          else {
            sVar6 = sVar4 + 0x40;
            if (0x28 < ap->gp_offset) goto LAB_00147140;
            ap->gp_offset = ap->gp_offset + 8;
          }
        }
        format = format + 1;
        sVar4 = sVar6;
      }
    }
  }
  return iVar3;
}

Assistant:

int SystemTools::EstimateFormatLength(const char *format, va_list ap)
{
  if (!format)
    {
    return 0;
    }

  // Quick-hack attempt at estimating the length of the string.
  // Should never under-estimate.

  // Start with the length of the format string itself.

  size_t length = strlen(format);

  // Increase the length for every argument in the format.

  const char* cur = format;
  while(*cur)
    {
    if(*cur++ == '%')
      {
      // Skip "%%" since it doesn't correspond to a va_arg.
      if(*cur != '%')
        {
        while(!int(isalpha(*cur)))
          {
          ++cur;
          }
        switch (*cur)
          {
          case 's':
          {
          // Check the length of the string.
          char* s = va_arg(ap, char*);
          if(s)
            {
            length += strlen(s);
            }
          } break;
          case 'e':
          case 'f':
          case 'g':
          {
          // Assume the argument contributes no more than 64 characters.
          length += 64;

          // Eat the argument.
          static_cast<void>(va_arg(ap, double));
          } break;
          default:
          {
          // Assume the argument contributes no more than 64 characters.
          length += 64;

          // Eat the argument.
          static_cast<void>(va_arg(ap, int));
          } break;
          }
        }

      // Move past the characters just tested.
      ++cur;
      }
    }

  return static_cast<int>(length);
}